

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::detail::
     value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
     format_custom_arg<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,fmt::v7::formatter<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  undefined8 this;
  iterator it;
  iterator it_00;
  undefined1 local_60 [8];
  formatter<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>,_char,_void>
  f;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx_local;
  parse_context_type *parse_ctx_local;
  void *arg_local;
  
  f.
  super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
  .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.precision_ref.val.name.size_
       = (size_t)ctx;
  formatter<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>,_char,_void>
  ::formatter((formatter<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>,_char,_void>
               *)local_60);
  it = formatter<fmt::v7::basic_string_view<char>,char,void>::
       parse<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>
                 ((formatter<fmt::v7::basic_string_view<char>,char,void> *)local_60,parse_ctx);
  basic_format_parse_context<char,_fmt::v7::detail::error_handler>::advance_to(parse_ctx,it);
  this = f.
         super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
         .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.precision_ref.val.
         name.size_;
  it_00 = formatter<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,char,void>
          ::format<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                    ((formatter<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,char,void>
                      *)local_60,
                     (arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>
                      *)arg,(basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
                            f.
                            super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
                            .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.
                            precision_ref.val.name.size_);
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::advance_to
            ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)this,it_00);
  return;
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }